

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControl::QWidgetTextControl(QWidgetTextControl *this,QObject *parent)

{
  long lVar1;
  QWidgetTextControlPrivate *pQVar2;
  QObject *in_RSI;
  QInputControl *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControlPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QWidgetTextControlPrivate *)operator_new(0x1b0);
  QWidgetTextControlPrivate::QWidgetTextControlPrivate(pQVar2);
  QInputControl::QInputControl(in_RDI,TextEdit,&pQVar2->super_QObjectPrivate,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d1ff90;
  pQVar2 = d_func((QWidgetTextControl *)0x713376);
  QString::QString((QString *)0x713394);
  QWidgetTextControlPrivate::init(pQVar2,(EVP_PKEY_CTX *)0x1);
  QString::~QString((QString *)0x7133b5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetTextControl::QWidgetTextControl(QObject *parent)
    : QInputControl(QInputControl::TextEdit, *new QWidgetTextControlPrivate, parent)
{
    Q_D(QWidgetTextControl);
    d->init();
}